

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O0

ssize_t get_argument(archive_string *as,char *p)

{
  char *in_RSI;
  long in_RDI;
  bool bVar1;
  ssize_t q;
  char *s;
  char in_stack_ffffffffffffffcf;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  archive_string *in_stack_ffffffffffffffd8;
  char *local_20;
  
  *(undefined8 *)(in_RDI + 8) = 0;
  local_20 = in_RSI;
  while( true ) {
    bVar1 = false;
    if (*local_20 != '\0') {
      bVar1 = *local_20 == ' ';
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  uVar2 = 0;
  while( true ) {
    bVar1 = false;
    if (*local_20 != '\0') {
      bVar1 = *local_20 != ' ';
    }
    if (bVar1 == false) break;
    if (*local_20 == '\\') {
      if (local_20[1] == '\0') {
        local_20 = local_20 + 1;
        break;
      }
      archive_strappend_char
                ((archive_string *)CONCAT17(uVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd0)),
                 in_stack_ffffffffffffffcf);
      local_20 = local_20 + 2;
    }
    else if (*local_20 == '\"') {
      in_stack_ffffffffffffffd8 =
           (archive_string *)
           extract_quotation(in_stack_ffffffffffffffd8,
                             (char *)CONCAT17(uVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd0)));
      if ((long)in_stack_ffffffffffffffd8 < 0) {
        return -0x19;
      }
      local_20 = local_20 + (long)&in_stack_ffffffffffffffd8->s;
    }
    else {
      archive_strappend_char
                ((archive_string *)CONCAT17(uVar2,CONCAT16(bVar1,in_stack_ffffffffffffffd0)),
                 in_stack_ffffffffffffffcf);
      local_20 = local_20 + 1;
    }
  }
  return (long)local_20 - (long)in_RSI;
}

Assistant:

static ssize_t
get_argument(struct archive_string *as, const char *p)
{
	const char *s = p;

	archive_string_empty(as);

	/* Skip beginning space characters. */
	while (*s != '\0' && *s == ' ')
		s++;
	/* Copy non-space characters. */
	while (*s != '\0' && *s != ' ') {
		if (*s == '\\') {
			if (s[1] != '\0') {
				archive_strappend_char(as, s[1]);
				s += 2;
			} else {
				s++;/* Ignore this character.*/
				break;
			}
		} else if (*s == '"') {
			ssize_t q = extract_quotation(as, s);
			if (q < 0)
				return (ARCHIVE_FAILED);/* Invalid sequence. */
			s += q;
		} else {
			archive_strappend_char(as, s[0]);
			s++;
		}
	}
	return ((ssize_t)(s - p));
}